

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::WriteLogBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  char cVar7;
  LogLevel LVar8;
  int iVar9;
  reference pvVar10;
  pointer pEVar11;
  _Head_base<0UL,_duckdb::WriteLogBindData_*,_false> this_01;
  pointer pWVar12;
  string *psVar13;
  type pEVar14;
  ParameterNotResolvedException *this_02;
  BinderException *pBVar15;
  InvalidTypeException *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  pointer *__ptr;
  size_type __n;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  templated_unique_single_t result;
  _Tuple_impl<0UL,_duckdb::WriteLogBindData_*,_std::default_delete<duckdb::WriteLogBindData>_>
  local_e8;
  Value local_e0;
  ScalarFunction *local_a0;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_80;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_a0 = bound_function;
  local_80._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar15 = (BinderException *)__cxa_allocate_exception(0x10);
    local_e0.type_._0_8_ =
         &local_e0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"write_log takes at least one argument","");
    BinderException::BinderException(pBVar15,(string *)&local_e0);
    __cxa_throw(pBVar15,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  LogicalType::LogicalType(&local_e0.type_,VARCHAR);
  bVar6 = LogicalType::operator==(&pEVar11->return_type,&local_e0.type_);
  LogicalType::~LogicalType(&local_e0.type_);
  if (!bVar6) {
    this_03 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    local_e0.type_._0_8_ =
         &local_e0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"write_log first argument must be a VARCHAR","");
    InvalidTypeException::InvalidTypeException(this_03,(string *)&local_e0);
    __cxa_throw(this_03,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01._M_head_impl = (WriteLogBindData *)operator_new(0x80);
  WriteLogBindData::WriteLogBindData(this_01._M_head_impl);
  local_e8.super__Head_base<0UL,_duckdb::WriteLogBindData_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::WriteLogBindData_*,_false>)
       (_Head_base<0UL,_duckdb::WriteLogBindData_*,_false>)this_01._M_head_impl;
  LogicalType::LogicalType(&local_e0.type_,VARCHAR);
  _Var5._M_pi = local_e0.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar4 = local_e0.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (local_a0->super_BaseScalarFunction).return_type.id_ = local_e0.type_.id_;
  (local_a0->super_BaseScalarFunction).return_type.physical_type_ = local_e0.type_.physical_type_;
  psVar1 = &(local_a0->super_BaseScalarFunction).return_type.type_info_;
  uVar16 = *(undefined4 *)
            &(psVar1->internal).
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar17 = *(undefined4 *)
            ((long)&(local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            );
  peVar3 = (psVar1->internal).super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar18 = *(undefined4 *)
            &(local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar19 = *(undefined4 *)
            ((long)&(local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e0.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_e0.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_98 = peVar3;
    uStack_90 = uVar18;
    uStack_8c = uVar19;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    uVar16 = (undefined4)local_98;
    uVar17 = local_98._4_4_;
    uVar18 = uStack_90;
    uVar19 = uStack_8c;
  }
  _Var5._M_pi = local_e0.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_e0.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(uVar17,uVar16);
  local_e0.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       uVar19;
  local_e0.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       uVar18;
  if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
  }
  LogicalType::~LogicalType(&local_e0.type_);
  if (8 < (ulong)((long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arguments->
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    local_98 = (element_type *)&(local_a0->super_BaseScalarFunction).return_type;
    local_78 = &(local_a0->super_BaseScalarFunction).return_type.type_info_;
    __n = 1;
    do {
      pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](arguments,__n);
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar10);
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (pEVar11->super_BaseExpression)._vptr_BaseExpression;
      cVar7 = (*(code *)params[1].field_2._M_allocated_capacity)(pEVar11);
      if (cVar7 != '\0') {
        this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(this_02);
        __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar10);
      iVar9 = ::std::__cxx11::string::compare((char *)&(pEVar11->super_BaseExpression).alias);
      if (iVar9 == 0) {
        pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(pvVar10);
        ThrowIfNotConstant(pEVar14);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar10);
        if ((pEVar11->return_type).id_ != BOOLEAN) {
          pBVar15 = (BinderException *)__cxa_allocate_exception(0x10);
          local_e0.type_._0_8_ =
               &local_e0.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"write_log: \'disable_logging\' argument must be a boolean"
                     ,"");
          BinderException::BinderException(pBVar15,(string *)&local_e0);
          __cxa_throw(pBVar15,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(pvVar10);
        ExpressionExecutor::EvaluateScalar(&local_e0,context,pEVar14,false);
        bVar6 = BooleanValue::Get(&local_e0);
        pWVar12 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                  ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                *)&local_e8);
        pWVar12->disable_logging = bVar6;
LAB_01143c41:
        Value::~Value(&local_e0);
      }
      else {
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar10);
        iVar9 = ::std::__cxx11::string::compare((char *)&(pEVar11->super_BaseExpression).alias);
        if (iVar9 == 0) {
          pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar10);
          ThrowIfNotConstant(pEVar14);
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar10);
          if ((pEVar11->return_type).id_ != VARCHAR) {
            pBVar15 = (BinderException *)__cxa_allocate_exception(0x10);
            local_e0.type_._0_8_ =
                 &local_e0.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"write_log: \'scope\' argument must be a string","");
            BinderException::BinderException(pBVar15,(string *)&local_e0);
            __cxa_throw(pBVar15,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar10);
          ExpressionExecutor::EvaluateScalar(&local_e0,context,pEVar14,false);
          StringValue::Get_abi_cxx11_(&local_e0);
          pWVar12 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                    ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                  *)&local_e8);
          ::std::__cxx11::string::_M_assign((string *)&pWVar12->scope);
          goto LAB_01143c41;
        }
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar10);
        iVar9 = ::std::__cxx11::string::compare((char *)&(pEVar11->super_BaseExpression).alias);
        if (iVar9 == 0) {
          pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar10);
          ThrowIfNotConstant(pEVar14);
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar10);
          if ((pEVar11->return_type).id_ != VARCHAR) {
            pBVar15 = (BinderException *)__cxa_allocate_exception(0x10);
            local_e0.type_._0_8_ =
                 &local_e0.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"write_log: \'level\' argument must be a string","");
            BinderException::BinderException(pBVar15,(string *)&local_e0);
            __cxa_throw(pBVar15,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar10);
          ExpressionExecutor::EvaluateScalar(&local_e0,context,pEVar14,false);
          psVar13 = StringValue::Get_abi_cxx11_(&local_e0);
          LVar8 = EnumUtil::FromString<duckdb::LogLevel>((psVar13->_M_dataplus)._M_p);
          pWVar12 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                    ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                  *)&local_e8);
          pWVar12->level = LVar8;
          goto LAB_01143c41;
        }
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar10);
        iVar9 = ::std::__cxx11::string::compare((char *)&(pEVar11->super_BaseExpression).alias);
        if (iVar9 == 0) {
          pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar10);
          ThrowIfNotConstant(pEVar14);
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar10);
          if ((pEVar11->return_type).id_ != VARCHAR) {
            pBVar15 = (BinderException *)__cxa_allocate_exception(0x10);
            local_e0.type_._0_8_ =
                 &local_e0.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"write_log: \'log_type\' argument must be a string","");
            BinderException::BinderException(pBVar15,(string *)&local_e0);
            __cxa_throw(pBVar15,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar10);
          ExpressionExecutor::EvaluateScalar(&local_e0,context,pEVar14,false);
          StringValue::Get_abi_cxx11_(&local_e0);
          pWVar12 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                    ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                  *)&local_e8);
          ::std::__cxx11::string::_M_assign((string *)&pWVar12->type);
          goto LAB_01143c41;
        }
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar10);
        iVar9 = ::std::__cxx11::string::compare((char *)&(pEVar11->super_BaseExpression).alias);
        if (iVar9 != 0) {
          pBVar15 = (BinderException *)__cxa_allocate_exception(0x10);
          local_50[0] = local_40;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"write_log: Unknown argument \'%s\'","");
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar10);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar2 = (pEVar11->super_BaseExpression).alias._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,
                     pcVar2 + (pEVar11->super_BaseExpression).alias._M_string_length);
          StringUtil::Format<std::__cxx11::string>
                    ((string *)&local_e0,(StringUtil *)local_50,&local_70,params);
          BinderException::BinderException(pBVar15,(string *)&local_e0);
          __cxa_throw(pBVar15,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar10);
        pWVar12 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                  ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                *)&local_e8);
        if (&pWVar12->return_type != &pEVar11->return_type) {
          (pWVar12->return_type).id_ = (pEVar11->return_type).id_;
          (pWVar12->return_type).physical_type_ = (pEVar11->return_type).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(pWVar12->return_type).type_info_,&(pEVar11->return_type).type_info_);
        }
        pWVar12 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                  ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                *)&local_e8);
        pWVar12->output_col = __n;
        pWVar12 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                  ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                                *)&local_e8);
        if (local_98 != (element_type *)&pWVar12->return_type) {
          (local_a0->super_BaseScalarFunction).return_type.id_ = (pWVar12->return_type).id_;
          (local_a0->super_BaseScalarFunction).return_type.physical_type_ =
               (pWVar12->return_type).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (local_78,&(pWVar12->return_type).type_info_);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pWVar12 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
            ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                          *)&local_e8);
  (pWVar12->context).ptr = context;
  *(_Head_base<0UL,_duckdb::WriteLogBindData_*,_false> *)
   local_80._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       local_e8.super__Head_base<0UL,_duckdb::WriteLogBindData_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_80._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> WriteLogBind(ClientContext &context, ScalarFunction &bound_function,
                                      vector<unique_ptr<Expression>> &arguments) {
	if (arguments.empty()) {
		throw BinderException("write_log takes at least one argument");
	}

	if (arguments[0]->return_type != LogicalType::VARCHAR) {
		throw InvalidTypeException("write_log first argument must be a VARCHAR");
	}

	// Used to replace the actual log call with a nop: useful for benchmarking
	auto result = make_uniq<WriteLogBindData>();

	// Default return type
	bound_function.return_type = LogicalType::VARCHAR;

	for (idx_t i = 1; i < arguments.size(); i++) {
		auto &arg = arguments[i];
		if (arg->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (arg->alias == "disable_logging") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::BOOLEAN) {
				throw BinderException("write_log: 'disable_logging' argument must be a boolean");
			}
			result->disable_logging = BooleanValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg));
		} else if (arg->alias == "scope") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("write_log: 'scope' argument must be a string");
			}
			result->scope = StringValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg));
		} else if (arg->alias == "level") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("write_log: 'level' argument must be a string");
			}
			result->level =
			    EnumUtil::FromString<LogLevel>(StringValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg)));
		} else if (arg->alias == "log_type") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("write_log: 'log_type' argument must be a string");
			}
			result->type = StringValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg));
		} else if (arg->alias == "return_value") {
			result->return_type = arg->return_type;
			result->output_col = i;
			bound_function.return_type = result->return_type;
		} else {
			throw BinderException(StringUtil::Format("write_log: Unknown argument '%s'", arg->alias));
		}
	}

	result->context = context;

	return std::move(result);
}